

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_location_count(CompilerGLSL *this,SPIRType *type)

{
  size_t sVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *type_00;
  uint32_t uVar4;
  uint32_t i;
  ulong uVar5;
  uint32_t i_1;
  
  if (type->basetype == Struct) {
    sVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    uVar4 = 0;
    for (uVar5 = 0; (uint)sVar1 != uVar5; uVar5 = uVar5 + 1) {
      type_00 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,
                           (type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar5]
                           .id);
      uVar2 = type_to_location_count(this,type_00);
      uVar4 = uVar4 + uVar2;
    }
  }
  else {
    uVar4 = type->columns + (uint)(type->columns == 0);
  }
  sVar1 = (type->array).super_VectorView<unsigned_int>.buffer_size;
  for (uVar2 = 0; (uint32_t)sVar1 != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = to_array_size_literal(this,type,uVar2);
    uVar4 = uVar4 * uVar3;
  }
  return uVar4;
}

Assistant:

uint32_t CompilerGLSL::type_to_location_count(const SPIRType &type) const
{
	uint32_t count;
	if (type.basetype == SPIRType::Struct)
	{
		uint32_t mbr_count = uint32_t(type.member_types.size());
		count = 0;
		for (uint32_t i = 0; i < mbr_count; i++)
			count += type_to_location_count(get<SPIRType>(type.member_types[i]));
	}
	else
	{
		count = type.columns > 1 ? type.columns : 1;
	}

	uint32_t dim_count = uint32_t(type.array.size());
	for (uint32_t i = 0; i < dim_count; i++)
		count *= to_array_size_literal(type, i);

	return count;
}